

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

double __thiscall
wasm::Random::pickGivenNum<double,long,unsigned_int,unsigned_long>
          (Random *this,size_t num,double first,long args,uint args_1,unsigned_long args_2)

{
  unsigned_long args_local_2;
  uint args_local_1;
  long args_local;
  double first_local;
  size_t num_local;
  Random *this_local;
  
  this_local = (Random *)first;
  if (num != 0) {
    this_local = (Random *)
                 pickGivenNum<double,unsigned_int,unsigned_long>
                           (this,num - 1,(double)args,args_1,args_2);
  }
  return (double)this_local;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }